

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyMemBackendInitFromParent(SyMemBackend *pBackend,SyMemBackend *pParent)

{
  SyMutex *pSVar1;
  sxu8 bInheritMutex;
  SyMemBackend *pParent_local;
  SyMemBackend *pBackend_local;
  
  SyZero(pBackend,0xb8);
  pBackend->pMethods = pParent->pMethods;
  pBackend->xMemError = pParent->xMemError;
  pBackend->pUserData = pParent->pUserData;
  if (pParent->pMutexMethods != (SyMutexMethods *)0x0) {
    pBackend->pMutexMethods = pParent->pMutexMethods;
    pSVar1 = (*pBackend->pMutexMethods->xNew)(1);
    pBackend->pMutex = pSVar1;
    if (pBackend->pMutex == (SyMutex *)0x0) {
      return -0x17;
    }
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 SyMemBackendInitFromParent(SyMemBackend *pBackend,const SyMemBackend *pParent)
{
	sxu8 bInheritMutex;
#if defined(UNTRUST)
	if( pBackend == 0 || SXMEM_BACKEND_CORRUPT(pParent) ){
		return SXERR_CORRUPT;
	}
#endif
	/* Zero the allocator first */
	SyZero(&(*pBackend), sizeof(SyMemBackend));
	pBackend->pMethods  = pParent->pMethods;
	pBackend->xMemError = pParent->xMemError;
	pBackend->pUserData = pParent->pUserData;
	bInheritMutex = pParent->pMutexMethods ? TRUE : FALSE;
	if( bInheritMutex ){
		pBackend->pMutexMethods = pParent->pMutexMethods;
		/* Create a private mutex */
		pBackend->pMutex = pBackend->pMutexMethods->xNew(SXMUTEX_TYPE_FAST);
		if( pBackend->pMutex ==  0){
			return SXERR_OS;
		}
	}
#if defined(UNTRUST)
	pBackend->nMagic = SXMEM_BACKEND_MAGIC;
#endif
	return SXRET_OK;
}